

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDeviceGLImpl.cpp
# Opt level: O0

void __thiscall
Diligent::RenderDeviceGLImpl::CreateRayTracingPipelineState
          (RenderDeviceGLImpl *this,RayTracingPipelineStateCreateInfo *PSOCreateInfo,
          IPipelineState **ppPipelineState)

{
  Char *Message;
  undefined1 local_40 [8];
  string msg;
  IPipelineState **ppPipelineState_local;
  RayTracingPipelineStateCreateInfo *PSOCreateInfo_local;
  RenderDeviceGLImpl *this_local;
  
  msg.field_2._8_8_ = ppPipelineState;
  FormatString<char[39]>((string *)local_40,(char (*) [39])"Ray tracing is not supported in OpenGL")
  ;
  Message = (Char *)std::__cxx11::string::c_str();
  DebugAssertionFailed
            (Message,"CreateRayTracingPipelineState",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/RenderDeviceGLImpl.cpp"
             ,0x23a);
  std::__cxx11::string::~string((string *)local_40);
  *(undefined8 *)msg.field_2._8_8_ = 0;
  return;
}

Assistant:

void RenderDeviceGLImpl::CreateRayTracingPipelineState(const RayTracingPipelineStateCreateInfo& PSOCreateInfo, IPipelineState** ppPipelineState)
{
    UNSUPPORTED("Ray tracing is not supported in OpenGL");
    *ppPipelineState = nullptr;
}